

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rambunctious-recitation.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  value_type vVar1;
  value_type vVar2;
  size_type sVar3;
  ostream *poVar4;
  int iVar5;
  size_type __pos;
  int local_2cc;
  vector<int,_std::allocator<int>_> numbers;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string input;
  _Vector_base<int,_std::allocator<int>_> local_268;
  _Vector_base<int,_std::allocator<int>_> local_250;
  ifstream file;
  int aiStack_218 [122];
  
  if (argc == 2) {
    std::ifstream::ifstream(&file,argv[1],_S_in);
    if (*(int *)((long)aiStack_218 + *(long *)(_file + -0x18)) == 0) {
      input._M_dataplus._M_p = (pointer)&input.field_2;
      input._M_string_length = 0;
      input.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&file,(string *)&input);
      numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      __pos = 0;
      while( true ) {
        sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(&input,',',__pos);
        if (sVar3 == 0xffffffffffffffff) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_2a8,&input,__pos,sVar3 - __pos);
        local_2cc = std::__cxx11::stoi(&local_2a8,(size_t *)0x0,10);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&numbers,&local_2cc);
        std::__cxx11::string::~string((string *)&local_2a8);
        __pos = sVar3 + 1;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_2a8,&input,__pos,0xffffffffffffffff);
      local_2cc = std::__cxx11::stoi(&local_2a8,(size_t *)0x0,10);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&numbers,&local_2cc);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_250,&numbers);
      vVar1 = game(0x7e4,(vector<int,_std::allocator<int>_> *)&local_250);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_250);
      poVar4 = std::operator<<((ostream *)&std::cout,"Part 1: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,vVar1);
      std::operator<<(poVar4,"\n");
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_268,&numbers);
      vVar2 = game(30000000,(vector<int,_std::allocator<int>_> *)&local_268);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_268);
      poVar4 = std::operator<<((ostream *)&std::cout,"Part 2: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,vVar2);
      std::operator<<(poVar4,"\n");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,vVar1);
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,vVar2);
      std::operator<<(poVar4,"\n");
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&numbers.super__Vector_base<int,_std::allocator<int>_>);
      std::__cxx11::string::~string((string *)&input);
      iVar5 = 0;
    }
    else {
      std::operator<<((ostream *)&std::cerr,"Could not open file\n");
      iVar5 = 1;
    }
    std::ifstream::~ifstream(&file);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Provide input file\n");
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  if (argc != 2) {
    std::cout << "Provide input file\n";
    return 0;
  }

  auto file = std::ifstream (argv[1]);

  if (!file.good()) {
    std::cerr << "Could not open file\n";
    return 1;
  }

  std::string input;
  std::getline(file, input);

  std::vector<int> numbers;

  size_t pos = 0;
  for(auto to = input.find(','); to != std::string::npos; to = input.find(',', pos)) {
    numbers.push_back(std::stoi(input.substr(pos, to - pos)));
    pos = to + 1;
  }
  numbers.push_back(std::stoi(input.substr(pos)));

  auto a1 = game(2020, numbers);
  std::cout << "Part 1: " << a1 << "\n";

  auto a2 = game(30000000, numbers);
  std::cout << "Part 2: " << a2 << "\n";

  std::cout << a1 << "\n" << a2 << "\n";
}